

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O0

void __thiscall
rr::FragmentProcessor::executeMaskedColorWrite
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,Vec4 *colorMaskFactor,Vec4 *colorMaskNegationFactor,bool isSRGB,
          PixelBufferAccess *colorBuffer)

{
  float fVar1;
  int iVar2;
  int z;
  Fragment *this_00;
  float *pfVar3;
  Vector<float,_4> local_c0;
  Vector<float,_4> local_b0;
  tcu local_a0 [8];
  float local_98 [2];
  tcu local_90 [8];
  float local_88 [2];
  VecAccess<float,_4,_3> local_80;
  undefined1 local_68 [8];
  Vec4 newColor;
  Vec4 originalColor;
  Fragment *frag;
  int local_38;
  int fragSampleNdx;
  int regSampleNdx;
  bool isSRGB_local;
  Vec4 *colorMaskNegationFactor_local;
  Vec4 *colorMaskFactor_local;
  Fragment *inputFragments_local;
  int numSamplesPerFragment_local;
  int fragNdxOffset_local;
  FragmentProcessor *this_local;
  
  for (local_38 = 0; local_38 < 0x40; local_38 = local_38 + 1) {
    if ((this->m_sampleRegister[local_38].isAlive & 1U) != 0) {
      this_00 = inputFragments + (fragNdxOffset + local_38 / numSamplesPerFragment);
      iVar2 = tcu::Vector<int,_2>::x(&this_00->pixelCoord);
      tcu::Vector<int,_2>::y(&this_00->pixelCoord);
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)(newColor.m_data + 2),(int)colorBuffer,
                 local_38 % numSamplesPerFragment,iVar2);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_68);
      tcu::Vector<float,_4>::xyz(&local_80,(Vector<float,_4> *)local_68);
      tcu::VecAccess<float,_4,_3>::operator=(&local_80,&this->m_sampleRegister[local_38].blendedRGB)
      ;
      fVar1 = this->m_sampleRegister[local_38].blendedA;
      pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_68);
      *pfVar3 = fVar1;
      if (isSRGB) {
        tcu::linearToSRGB(local_90,(Vec4 *)local_68);
        local_68[0] = local_90[0];
        local_68[1] = local_90[1];
        local_68[2] = local_90[2];
        local_68[3] = local_90[3];
        local_68[4] = local_90[4];
        local_68[5] = local_90[5];
        local_68[6] = local_90[6];
        local_68[7] = local_90[7];
        newColor.m_data[0] = local_88[0];
        newColor.m_data[1] = local_88[1];
      }
      tcu::operator*((tcu *)&local_b0,colorMaskFactor,(Vector<float,_4> *)local_68);
      tcu::operator*((tcu *)&local_c0,colorMaskNegationFactor,
                     (Vector<float,_4> *)(newColor.m_data + 2));
      tcu::operator+(local_a0,&local_b0,&local_c0);
      local_68[0] = local_a0[0];
      local_68[1] = local_a0[1];
      local_68[2] = local_a0[2];
      local_68[3] = local_a0[3];
      local_68[4] = local_a0[4];
      local_68[5] = local_a0[5];
      local_68[6] = local_a0[6];
      local_68[7] = local_a0[7];
      newColor.m_data[0] = local_98[0];
      newColor.m_data[1] = local_98[1];
      iVar2 = tcu::Vector<int,_2>::x(&this_00->pixelCoord);
      z = tcu::Vector<int,_2>::y(&this_00->pixelCoord);
      tcu::PixelBufferAccess::setPixel
                (colorBuffer,(Vec4 *)local_68,local_38 % numSamplesPerFragment,iVar2,z);
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeMaskedColorWrite (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const Vec4& colorMaskFactor, const Vec4& colorMaskNegationFactor, bool isSRGB, const tcu::PixelBufferAccess& colorBuffer)
{
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)
	{
		if (m_sampleRegister[regSampleNdx].isAlive)
		{
			int					fragSampleNdx	= regSampleNdx % numSamplesPerFragment;
			const Fragment&		frag			= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];
			Vec4				originalColor	= colorBuffer.getPixel(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
			Vec4				newColor;

			newColor.xyz()	= m_sampleRegister[regSampleNdx].blendedRGB;
			newColor.w()	= m_sampleRegister[regSampleNdx].blendedA;

			if (isSRGB)
				newColor = tcu::linearToSRGB(newColor);

			newColor = colorMaskFactor*newColor + colorMaskNegationFactor*originalColor;

			colorBuffer.setPixel(newColor, fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());
		}
	}
}